

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.h
# Opt level: O0

ValVec * __thiscall
dg::llvmdg::InterproceduralNTSCD::getDependencies(InterproceduralNTSCD *this,BasicBlock *b)

{
  bool bVar1;
  LLVMControlDependenceAnalysisOptions *this_00;
  pointer ppVar2;
  iterator __last;
  iterator this_01;
  LLVMControlDependenceAnalysisImpl *in_RSI;
  ValVec *in_RDI;
  pair<std::_Rb_tree_const_iterator<llvm::Value_*>,_bool> pVar3;
  Value *val;
  CDNode *dep;
  iterator __end2;
  iterator __begin2;
  set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *__range2;
  set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_> ret;
  iterator dit;
  CDNode *block;
  InterproceduralNTSCD *in_stack_000001f0;
  set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>
  *in_stack_ffffffffffffff28;
  ValVec *this_02;
  CDNode *in_stack_ffffffffffffff48;
  ICDGraphBuilder *in_stack_ffffffffffffff50;
  _Rb_tree_const_iterator<llvm::Value_*> in_stack_ffffffffffffff60;
  _Self local_78;
  _Self local_70;
  set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *local_68;
  _Self local_30;
  _Self local_28;
  CDNode *local_20;
  
  this_02 = in_RDI;
  this_00 = LLVMControlDependenceAnalysisImpl::getOptions(in_RSI);
  bVar1 = LLVMControlDependenceAnalysisOptions::nodePerInstruction(this_00);
  if (bVar1) {
    memset(this_02,0,0x18);
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
              ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)0x234617);
  }
  else {
    _compute(in_stack_000001f0);
    local_20 = ICDGraphBuilder::getNode
                         (in_stack_ffffffffffffff50,(Value *)in_stack_ffffffffffffff48);
    if (local_20 == (CDNode *)0x0) {
      memset(this_02,0,0x18);
      std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
                ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)0x23466a);
    }
    else {
      local_28._M_node =
           (_Base_ptr)
           std::
           map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
           ::find((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                   *)in_stack_ffffffffffffff28,(key_type *)0x234688);
      local_30._M_node =
           (_Base_ptr)
           std::
           map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
           ::end((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  *)in_stack_ffffffffffffff28);
      bVar1 = std::operator==(&local_28,&local_30);
      if (bVar1) {
        memset(this_02,0,0x18);
        std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
                  ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)0x2346df);
      }
      else {
        std::set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>::set
                  ((set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_> *)
                   0x2346ee);
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>
                               *)0x2346fb);
        local_68 = &ppVar2->second;
        local_70._M_node =
             (_Base_ptr)
             std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::begin
                       ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *
                        )in_stack_ffffffffffffff28);
        local_78._M_node =
             (_Base_ptr)
             std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::end
                       ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *
                        )in_stack_ffffffffffffff28);
        while( true ) {
          bVar1 = std::operator!=(&local_70,&local_78);
          if (!bVar1) break;
          std::_Rb_tree_const_iterator<dg::CDNode_*>::operator*
                    ((_Rb_tree_const_iterator<dg::CDNode_*> *)0x234741);
          ICDGraphBuilder::getValue(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          pVar3 = std::set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>
                  ::insert((set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>
                            *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
          in_stack_ffffffffffffff60 = pVar3.first._M_node;
          std::_Rb_tree_const_iterator<dg::CDNode_*>::operator++
                    ((_Rb_tree_const_iterator<dg::CDNode_*> *)this_02);
        }
        __last = std::set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>::
                 begin(in_stack_ffffffffffffff28);
        this_01 = std::set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>
                  ::end(in_stack_ffffffffffffff28);
        std::allocator<llvm::Value_*>::allocator((allocator<llvm::Value_*> *)0x2347b7);
        std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
        vector<std::_Rb_tree_const_iterator<llvm::Value*>,void>
                  ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)this_01._M_node,
                   in_stack_ffffffffffffff60,(_Rb_tree_const_iterator<llvm::Value_*>)__last._M_node,
                   (allocator_type *)in_stack_ffffffffffffff48);
        std::allocator<llvm::Value_*>::~allocator((allocator<llvm::Value_*> *)0x2347da);
        std::set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>::~set
                  ((set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_> *)
                   0x2347e4);
      }
    }
  }
  return in_RDI;
}

Assistant:

ValVec getDependencies(const llvm::BasicBlock *b) override {
        if (getOptions().nodePerInstruction()) {
            return {};
        }

        _compute();

        auto *block = igraphBuilder.getNode(b);
        if (!block) {
            return {};
        }

        assert(_computed && "Did not compute CD");
        auto dit = controlDependence.find(block);
        if (dit == controlDependence.end())
            return {};

        std::set<llvm::Value *> ret;
        for (auto *dep : dit->second) {
            const auto *val = igraphBuilder.getValue(dep);
            assert(val && "Invalid value");
            ret.insert(const_cast<llvm::Value *>(val));
        }

        return ValVec{ret.begin(), ret.end()};
    }